

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O1

void __thiscall
pico_tree::internal::
list_pool_resource<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL>::
~list_pool_resource(list_pool_resource<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL>
                    *this)

{
  node *pnVar1;
  node *pnVar2;
  
  this->_vptr_list_pool_resource = (_func_int **)&PTR__list_pool_resource_00106d98;
  pnVar2 = this->head_;
  while (pnVar2 != (node *)0x0) {
    pnVar1 = pnVar2->prev;
    operator_delete(pnVar2,0x2808);
    this->head_ = pnVar1;
    pnVar2 = pnVar1;
  }
  operator_delete(this,0x10);
  return;
}

Assistant:

virtual ~list_pool_resource() { release(); }